

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_clusterizer.h
# Opt level: O2

void __thiscall
crnlib::clusterizer<crnlib::vec<2U,_float>_>::split_node
          (clusterizer<crnlib::vec<2U,_float>_> *this,uint index)

{
  vector<unsigned_int> *this_00;
  vector<unsigned_int> *this_01;
  pair<crnlib::vec<2U,_float>,_unsigned_int> *rhs;
  uint uVar1;
  uint uVar2;
  pair<crnlib::vec<2U,_float>,_unsigned_int> *ppVar3;
  int iVar4;
  int iVar5;
  long lVar6;
  ulong uVar7;
  uint *obj;
  uint node_index;
  uint i;
  ulong uVar8;
  vq_node *pvVar9;
  vq_node *this_02;
  float fVar10;
  float fVar11;
  float fVar12;
  float val;
  float fVar13;
  float fVar14;
  ulong local_a0;
  ulong local_98;
  vec<2U,_float> local_90;
  vec<2U,_float> local_88;
  vec<2U,_float> right_child;
  vec<2U,_float> left_child;
  vec<2U,_float> local_38;
  
  pvVar9 = (this->m_nodes).m_p;
  if (pvVar9[index].m_vectors.m_size != 1) {
    pvVar9 = pvVar9 + index;
    if (this->m_quick == true) {
      compute_split_estimate(this,&left_child,&right_child,pvVar9);
    }
    else {
      compute_split_pca(this,&left_child,&right_child,pvVar9);
    }
    iVar4 = 8;
    if (this->m_quick != false) {
      iVar4 = 2;
    }
    this_00 = &this->m_left_children;
    this_01 = &this->m_right_children;
    fVar13 = 0.0;
    fVar14 = 0.0;
    local_98 = 0;
    local_a0 = 0;
    fVar10 = 1e+10;
    for (iVar5 = 0; iVar5 != iVar4; iVar5 = iVar5 + 1) {
      vector<unsigned_int>::resize(this_00,0,false);
      vector<unsigned_int>::resize(this_01,0,false);
      local_88.m_s[0] = 0.0;
      local_88.m_s[1] = 0.0;
      local_90.m_s[0] = 0.0;
      local_90.m_s[1] = 0.0;
      fVar13 = 0.0;
      lVar6 = 0;
      fVar14 = 0.0;
      local_98 = 0;
      local_a0 = 0;
      for (uVar8 = 0; uVar8 < (pvVar9->m_vectors).m_size; uVar8 = uVar8 + 1) {
        uVar1 = *(uint *)((long)(pvVar9->m_vectors).m_p + lVar6);
        ppVar3 = (this->m_training_vecs).m_p;
        rhs = ppVar3 + uVar1;
        uVar7 = (ulong)ppVar3[uVar1].second;
        fVar11 = vec<2U,_float>::squared_distance(&left_child,&rhs->first);
        fVar12 = vec<2U,_float>::squared_distance(&right_child,&rhs->first);
        obj = (uint *)((long)(pvVar9->m_vectors).m_p + lVar6);
        val = (float)uVar7;
        if (fVar12 <= fVar11) {
          vector<unsigned_int>::push_back(this_01,obj);
          operator*(&rhs->first,val);
          vec<2U,_float>::operator+=(&local_90,&local_38);
          local_98 = local_98 + uVar7;
          fVar11 = (rhs->first).m_s[0];
          fVar12 = (rhs->first).m_s[1];
          fVar13 = fVar13 + (fVar12 * fVar12 + fVar11 * fVar11) * val;
        }
        else {
          vector<unsigned_int>::push_back(this_00,obj);
          operator*(&rhs->first,val);
          vec<2U,_float>::operator+=(&local_88,&local_38);
          local_a0 = local_a0 + uVar7;
          fVar11 = (rhs->first).m_s[0];
          fVar12 = (rhs->first).m_s[1];
          fVar14 = fVar14 + (fVar12 * fVar12 + fVar11 * fVar11) * val;
        }
        lVar6 = lVar6 + 4;
      }
      if ((local_a0 == 0) || (local_98 == 0)) {
        pvVar9->m_unsplittable = true;
        return;
      }
      fVar14 = fVar14 - (local_88.m_s[1] * local_88.m_s[1] + local_88.m_s[0] * local_88.m_s[0]) /
                        (float)local_a0;
      fVar13 = fVar13 - (local_90.m_s[1] * local_90.m_s[1] + local_90.m_s[0] * local_90.m_s[0]) /
                        (float)local_98;
      vec<2U,_float>::operator*=(&local_88,1.0 / (float)local_a0);
      vec<2U,_float>::operator*=(&local_90,1.0 / (float)local_98);
      vec<2U,_float>::operator=(&left_child,&local_88);
      vec<2U,_float>::operator=(&right_child,&local_90);
      fVar11 = fVar14 + fVar13;
      if ((fVar11 < 1e-05) || ((fVar10 - fVar11) / fVar11 < 0.00125)) break;
      fVar10 = fVar11;
    }
    uVar1 = (this->m_nodes).m_size;
    node_index = uVar1 + 1;
    pvVar9->m_left = uVar1;
    pvVar9->m_right = node_index;
    uVar2 = this->m_split_index;
    pvVar9->m_codebook_index = uVar2;
    this->m_split_index = uVar2 + 1;
    vector<crnlib::clusterizer<crnlib::vec<2U,_float>_>::vq_node>::resize
              (&this->m_nodes,uVar1 + 2,false);
    pvVar9 = (this->m_nodes).m_p;
    this_02 = pvVar9 + node_index;
    vec<2U,_float>::operator=(&pvVar9[uVar1].m_centroid,&left_child);
    pvVar9[uVar1].m_total_weight = local_a0;
    vector<unsigned_int>::swap(&pvVar9[uVar1].m_vectors,this_00);
    pvVar9[uVar1].m_variance = fVar14;
    if ((1 < pvVar9[uVar1].m_vectors.m_size) && (0.0 < fVar14)) {
      insert_heap(this,uVar1);
    }
    vec<2U,_float>::operator=(&this_02->m_centroid,&right_child);
    this_02->m_total_weight = local_98;
    vector<unsigned_int>::swap(&this_02->m_vectors,this_01);
    this_02->m_variance = fVar13;
    if ((1 < (this_02->m_vectors).m_size) && (0.0 < fVar13)) {
      insert_heap(this,node_index);
    }
  }
  return;
}

Assistant:

training_vec_array& get_training_vecs()
        {
            return m_training_vecs;
        }